

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O2

Type wabt::GetMemoryType(Type operand_type,Opcode opc)

{
  bool bVar1;
  Enum EVar2;
  char *__s;
  Address AVar3;
  Enum e;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  Opcode opc_local;
  Type local_38;
  string_view name;
  
  if ((~operand_type.enum_ & 0xfffffffeU) == 0) {
    opc_local = opc;
    __s = Opcode::GetName(&opc_local);
    name._M_len = strlen(__s);
    name._M_str = __s;
    __x = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&name,name._M_len - 2,0xffffffffffffffff);
    __y._M_str = "_u";
    __y._M_len = 2;
    bVar1 = std::operator==(__x,__y);
    AVar3 = Opcode::GetMemorySize(&opc_local);
    if (AVar3 == 4) {
      e = (uint)bVar1 + I32 | I32U;
    }
    else {
      if (AVar3 == 2) {
        EVar2 = I16U;
        e = I16;
      }
      else {
        if (AVar3 != 1) {
          return operand_type;
        }
        EVar2 = I8U;
        e = I8;
      }
      if (bVar1) {
        e = EVar2;
      }
    }
    Type::Type(&local_38,e);
    operand_type = local_38;
  }
  return operand_type;
}

Assistant:

inline Type GetMemoryType(Type operand_type, Opcode opc) {
  // TODO: something something SIMD.
  // TODO: this loses information of the type it is read into.
  // That may well not be the biggest deal since that is usually obvious
  // from context, if not, we should probably represent that as a cast around
  // the access, since it should not be part of the field type.
  if (operand_type == Type::I32 || operand_type == Type::I64) {
    auto name = std::string_view(opc.GetName());
    // FIXME: change into a new column in opcode.def instead?
    auto is_unsigned = name.substr(name.size() - 2) == "_u";
    switch (opc.GetMemorySize()) {
      case 1: return is_unsigned ? Type::I8U : Type::I8;
      case 2: return is_unsigned ? Type::I16U : Type::I16;
      case 4: return is_unsigned ? Type::I32U : Type::I32;
    }
  }
  return operand_type;
}